

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

int xar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  size_t used;
  size_t local_38;
  
  local_38 = 0;
  plVar2 = (long *)a->format->data;
  if (plVar2[0x3d] != 0) {
    __archive_read_consume(a,plVar2[0x3d]);
    plVar2[0x3d] = 0;
  }
  iVar5 = 1;
  if (((int)plVar2[3] == 0) && (plVar2[0x3c] != 0)) {
    if ((int)plVar2[0x3a] != 0) {
      iVar5 = rd_contents_init(a,*(enctype *)(plVar2 + 0x3f),(int)plVar2[0x40],(int)plVar2[0x45]);
      if (iVar5 != 0) {
        plVar2[0x3c] = 0;
        return iVar5;
      }
      *(undefined4 *)(plVar2 + 0x3a) = 0;
    }
    *buff = (void *)0x0;
    iVar5 = rd_contents(a,buff,size,&local_38,plVar2[0x3c]);
    if (iVar5 == 0) {
      *offset = plVar2[0x3b];
      lVar3 = plVar2[0x3b];
      sVar4 = *size;
      plVar2[0x3b] = lVar3 + sVar4;
      plVar2[1] = plVar2[1] + *size;
      *plVar2 = *plVar2 + local_38;
      plVar1 = plVar2 + 0x3c;
      *plVar1 = *plVar1 - local_38;
      plVar2[0x3d] = local_38;
      if (*plVar1 != 0) {
        return 0;
      }
      if (lVar3 + sVar4 == plVar2[0x3e]) {
        iVar5 = checksum_final(a,plVar2 + 0x42,plVar2[0x41],plVar2 + 0x47,plVar2[0x46]);
        if (iVar5 == 0) {
          return 0;
        }
      }
      else {
        archive_set_error(&a->archive,-1,"Decompressed size error");
        iVar5 = -0x1e;
      }
    }
  }
  *buff = (void *)0x0;
  *size = 0;
  *offset = plVar2[1];
  return iVar5;
}

Assistant:

static int
xar_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct xar *xar;
	size_t used = 0;
	int r;

	xar = (struct xar *)(a->format->data);

	if (xar->entry_unconsumed) {
		__archive_read_consume(a, xar->entry_unconsumed);
		xar->entry_unconsumed = 0;
	}

	if (xar->end_of_file || xar->entry_remaining <= 0) {
		r = ARCHIVE_EOF;
		goto abort_read_data;
	}

	if (xar->entry_init) {
		r = rd_contents_init(a, xar->entry_encoding,
		    xar->entry_a_sum.alg, xar->entry_e_sum.alg);
		if (r != ARCHIVE_OK) {
			xar->entry_remaining = 0;
			return (r);
		}
		xar->entry_init = 0;
	}

	*buff = NULL;
	r = rd_contents(a, buff, size, &used, xar->entry_remaining);
	if (r != ARCHIVE_OK)
		goto abort_read_data;

	*offset = xar->entry_total;
	xar->entry_total += *size;
	xar->total += *size;
	xar->offset += used;
	xar->entry_remaining -= used;
	xar->entry_unconsumed = used;

	if (xar->entry_remaining == 0) {
		if (xar->entry_total != xar->entry_size) {
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Decompressed size error");
			r = ARCHIVE_FATAL;
			goto abort_read_data;
		}
		r = checksum_final(a,
		    xar->entry_a_sum.val, xar->entry_a_sum.len,
		    xar->entry_e_sum.val, xar->entry_e_sum.len);
		if (r != ARCHIVE_OK)
			goto abort_read_data;
	}

	return (ARCHIVE_OK);
abort_read_data:
	*buff = NULL;
	*size = 0;
	*offset = xar->total;
	return (r);
}